

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O3

int __thiscall zmq::socket_t::close(socket_t *this,int __fd)

{
  int in_EAX;
  
  if ((this->super_socket_base)._handle != (void *)0x0) {
    in_EAX = zmq_close();
    (this->super_socket_base)._handle = (void *)0x0;
  }
  return in_EAX;
}

Assistant:

void close() ZMQ_NOTHROW
    {
        if (_handle == ZMQ_NULLPTR)
            // already closed
            return;
        int rc = zmq_close(_handle);
        ZMQ_ASSERT(rc == 0);
        _handle = ZMQ_NULLPTR;
    }